

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_handler.cc
# Opt level: O2

size_t __thiscall
helix::nasdaq::itch50_handler::process_packet(itch50_handler *this,packet_view *packet)

{
  size_t sVar1;
  unknown_message_type *this_00;
  size_t sStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  switch(*packet->_buf) {
  case 'A':
    sVar1 = process_msg<itch50_add_order>(this,packet);
    return sVar1;
  case 'B':
    sStack_60 = 0x13;
    break;
  case 'C':
    sVar1 = process_msg<itch50_order_executed_with_price>(this,packet);
    return sVar1;
  case 'D':
    sVar1 = process_msg<itch50_order_delete>(this,packet);
    return sVar1;
  case 'E':
    sVar1 = process_msg<itch50_order_executed>(this,packet);
    return sVar1;
  case 'F':
    sVar1 = process_msg<itch50_add_order_mpid>(this,packet);
    return sVar1;
  default:
    this_00 = (unknown_message_type *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_58,'\x01');
    std::operator+(&local_38,"unknown type: ",&local_58);
    unknown_message_type::unknown_message_type(this_00,&local_38);
    __cxa_throw(this_00,&unknown_message_type::typeinfo,std::runtime_error::~runtime_error);
  case 'H':
    sVar1 = process_msg<itch50_stock_trading_action>(this,packet);
    return sVar1;
  case 'I':
    sStack_60 = 0x32;
    break;
  case 'K':
    sStack_60 = 0x1c;
    break;
  case 'L':
    sStack_60 = 0x1a;
    break;
  case 'N':
  case 'Y':
    sStack_60 = 0x14;
    break;
  case 'P':
    sVar1 = process_msg<itch50_trade>(this,packet);
    return sVar1;
  case 'Q':
    sVar1 = process_msg<itch50_cross_trade>(this,packet);
    return sVar1;
  case 'R':
    sVar1 = process_msg<itch50_stock_directory>(this,packet);
    return sVar1;
  case 'S':
  case 'W':
    sStack_60 = 0xc;
    break;
  case 'U':
    sVar1 = process_msg<itch50_order_replace>(this,packet);
    return sVar1;
  case 'V':
    sStack_60 = 0x23;
    break;
  case 'X':
    sVar1 = process_msg<itch50_order_cancel>(this,packet);
    return sVar1;
  }
  return sStack_60;
}

Assistant:

itch50_handler::itch50_handler()
{
}